

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O0

ON_4fPoint * __thiscall ON_4fPoint::operator+=(ON_4fPoint *this,ON_4fPoint *p)

{
  float fVar1;
  float fVar2;
  double dVar3;
  float local_48;
  float local_44;
  double s2;
  double s1;
  double sw2;
  double sw1;
  ON_4fPoint *p_local;
  ON_4fPoint *this_local;
  
  if ((p->w != this->w) || (NAN(p->w) || NAN(this->w))) {
    if ((p->w != 0.0) || (NAN(p->w))) {
      if ((this->w != 0.0) || (NAN(this->w))) {
        if (this->w <= 0.0) {
          dVar3 = std::sqrt((double)(ulong)(uint)-this->w);
          local_44 = -SUB84(dVar3,0);
        }
        else {
          dVar3 = std::sqrt((double)(ulong)(uint)this->w);
          local_44 = SUB84(dVar3,0);
        }
        if (p->w <= 0.0) {
          dVar3 = std::sqrt((double)(ulong)(uint)-p->w);
          local_48 = -SUB84(dVar3,0);
        }
        else {
          dVar3 = std::sqrt((double)(ulong)(uint)p->w);
          local_48 = SUB84(dVar3,0);
        }
        fVar2 = local_48 / local_44;
        fVar1 = local_44 / local_48;
        this->x = this->x * fVar2 + p->x * fVar1;
        this->y = this->y * fVar2 + p->y * fVar1;
        this->z = this->z * fVar2 + p->z * fVar1;
        this->w = local_44 * local_48;
      }
      else {
        this->x = p->x + this->x;
        this->y = p->y + this->y;
        this->z = p->z + this->z;
        this->w = p->w;
      }
    }
    else {
      this->x = p->x + this->x;
      this->y = p->y + this->y;
      this->z = p->z + this->z;
    }
  }
  else {
    this->x = p->x + this->x;
    this->y = p->y + this->y;
    this->z = p->z + this->z;
  }
  return this;
}

Assistant:

ON_4fPoint& ON_4fPoint::operator+=(const ON_4fPoint& p)
{
  // sum w = sqrt(w1*w2)
  if ( p.w == w ) {
    x += p.x;
    y += p.y;
    z += p.z;
  }
  else if (p.w == 0.0 ) {
    x += p.x;
    y += p.y;
    z += p.z;
  }
  else if ( w == 0.0 ) {
    x += p.x;
    y += p.y;
    z += p.z;
    w = p.w;
  }
  else {
    const double sw1 = (w>0.0) ? sqrt(w) : -sqrt(-w);
    const double sw2 = (p.w>0.0) ? sqrt(p.w) : -sqrt(-p.w);
    const double s1 = sw2/sw1;
    const double s2 = sw1/sw2;
    x = (float)(x*s1 + p.x*s2);
    y = (float)(y*s1 + p.y*s2);
    z = (float)(z*s1 + p.z*s2);
    w = (float)(sw1*sw2);
  }
  return *this;
}